

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O0

int __thiscall doctest::String::copy(String *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  size_t sVar1;
  char *pcVar2;
  String *other_local;
  String *this_local;
  
  if (this->m_str != (char *)0x0) {
    free(this->m_str);
  }
  sVar1 = detail::my_strlen(*(char **)dst);
  pcVar2 = (char *)malloc(sVar1 + 1);
  this->m_str = pcVar2;
  pcVar2 = strcpy(this->m_str,*(char **)dst);
  return (int)pcVar2;
}

Assistant:

void String::copy(const String& other) {
    if(m_str)
        free(m_str);
    m_str = static_cast<char*>(malloc(detail::my_strlen(other.m_str) + 1));
    strcpy(m_str, other.m_str);
}